

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

void expels(monst *mtmp,permonst *mdat,boolean message)

{
  uchar uVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  char blast [40];
  
  if (message != '\0') {
    if ((mdat->mflags1 & 0x40000) == 0) {
      blast._0_8_ = blast._0_8_ & 0xffffffffffffff00;
      lVar3 = 4;
      while ((lVar3 != 10 && (mdat->mattk[lVar3 + -4].aatyp != '\v'))) {
        lVar3 = lVar3 + 1;
      }
      if (mdat == mons + 0x9f || mdat->mlet == '\x16') {
        uVar1 = mdat->mattk[lVar3 + -4].adtyp;
        if (uVar1 == '\x03') {
          builtin_strncpy(blast," in a blast of frost",0x15);
        }
        else if (uVar1 == '\x06') {
          builtin_strncpy(blast," in a shower of sparks",0x17);
        }
      }
      else {
        builtin_strncpy(blast," with a squelch",0x10);
      }
      pcVar4 = mon_nam(mtmp);
      pline("You get expelled from %s%s!",pcVar4,blast);
    }
    else {
      pline("You get regurgitated!");
    }
  }
  unstuck(mtmp);
  mnexto(mtmp);
  newsym((int)u.ux,(int)u.uy);
  spoteffects('\x01');
  bVar2 = um_dist(mtmp->mx,mtmp->my,'\x01');
  if (bVar2 != '\0') {
    pline("Brrooaa...  You land hard at some distance.");
  }
  return;
}

Assistant:

void expels(struct monst *mtmp,
	    const struct permonst *mdat, /* if mtmp is polymorphed, mdat != mtmp->data */
	    boolean message)
{
	if (message) {
		if (is_animal(mdat))
			pline("You get regurgitated!");
		else {
			char blast[40];
			int i;

			blast[0] = '\0';
			for (i = 0; i < NATTK; i++)
				if (mdat->mattk[i].aatyp == AT_ENGL)
					break;
			if (i < NATTK && mdat->mattk[i].aatyp != AT_ENGL) {
			      warning("Swallower has no engulfing attack?");
			} else {
				if (is_whirly(mdat)) {
					switch (mdat->mattk[i].adtyp) {
						case AD_ELEC:
							strcpy(blast,
						      " in a shower of sparks");
							break;
						case AD_COLD:
							strcpy(blast,
							" in a blast of frost");
							break;
					}
				} else
					strcpy(blast, " with a squelch");
				pline("You get expelled from %s%s!",
				    mon_nam(mtmp), blast);
			}
		}
	}
	unstuck(mtmp);	/* ball&chain returned in unstuck() */
	mnexto(mtmp);
	newsym(u.ux,u.uy);
	spoteffects(TRUE);
	/* to cover for a case where mtmp is not in a next square */
	if (um_dist(mtmp->mx,mtmp->my,1))
		pline("Brrooaa...  You land hard at some distance.");
}